

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles2::Functional::apiVarValueStr_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,VarValue *value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  string *psVar4;
  uint extraout_EDX;
  uint precision;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar5;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  undefined8 uVar6;
  char *pcVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  ostringstream result;
  size_type *local_348;
  long local_340;
  size_type local_338 [2];
  string *local_328;
  string local_320 [3];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  uVar3 = glu::getDataTypeScalarSize(*(DataType *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if ((int)uVar3 < 2) {
    uVar5 = extraout_RDX;
    if (uVar3 != 1) goto LAB_00f74999;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
    uVar5 = extraout_RDX_00;
  }
  uVar9 = 0;
  local_328 = __return_storage_ptr__;
  do {
    precision = (uint)uVar5;
    if (uVar9 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      precision = extraout_EDX;
    }
    iVar2 = *(int *)this;
    if (iVar2 - 1U < 4) {
LAB_00f74866:
      de::floatToString_abi_cxx11_(local_320,(de *)0x2,*(float *)(this + uVar9 * 4 + 4),precision);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_320[0]._M_dataplus._M_p,local_320[0]._M_string_length);
      uVar5 = extraout_RDX_01;
      uVar6 = local_320[0].field_2._M_allocated_capacity;
      _Var8._M_p = local_320[0]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
LAB_00f7489b:
        operator_delete(_Var8._M_p,uVar6 + 1);
        uVar5 = extraout_RDX_02;
      }
    }
    else {
      uVar1 = iVar2 - 0x12;
      precision = CONCAT31((int3)(uVar1 >> 8),8 < uVar1);
      uVar5 = (ulong)precision;
      if (iVar2 - 5U < 9 || 8 >= uVar1) goto LAB_00f74866;
      if (iVar2 - 0x1bU < 4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::ostream::operator<<(local_320,*(int *)(this + uVar9 * 4 + 4));
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_348,local_340);
        uVar5 = extraout_RDX_03;
        uVar6 = local_338[0];
        _Var8._M_p = (pointer)local_348;
        if (local_348 == local_338) goto LAB_00f748a3;
        goto LAB_00f7489b;
      }
      if (iVar2 - 0x23U < 4) {
        pcVar7 = "false";
        if ((ulong)(byte)this[uVar9 + 4] != 0) {
          pcVar7 = "true";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar7,(ulong)(byte)this[uVar9 + 4] ^ 5);
        uVar5 = extraout_RDX_04;
      }
      else if (iVar2 - 0x27U < 0x1e) {
        std::ostream::operator<<((ostream *)local_1a8,*(int *)(this + 4));
        uVar5 = extraout_RDX_05;
      }
    }
LAB_00f748a3:
    uVar9 = uVar9 + 1;
  } while (uVar3 != uVar9);
  if (1 < (int)uVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
  }
LAB_00f74999:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar4 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar4;
}

Assistant:

static string apiVarValueStr (const VarValue& value)
{
	const int			numElems = glu::getDataTypeScalarSize(value.type);
	std::ostringstream	result;

	if (numElems > 1)
		result << "(";

	for (int i = 0; i < numElems; i++)
	{
		if (i > 0)
			result << ", ";

		if (glu::isDataTypeFloatOrVec(value.type) || glu::isDataTypeMatrix(value.type))
			result << de::floatToString(value.val.floatV[i], 2);
		else if (glu::isDataTypeIntOrIVec((value.type)))
			result << de::toString(value.val.intV[i]);
		else if (glu::isDataTypeBoolOrBVec((value.type)))
			result << (value.val.boolV[i] ? "true" : "false");
		else if (glu::isDataTypeSampler((value.type)))
			result << value.val.samplerV.unit;
		else
			DE_ASSERT(false);
	}

	if (numElems > 1)
		result << ")";

	return result.str();
}